

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O0

void __thiscall SparseMatrix::~SparseMatrix(SparseMatrix *this)

{
  undefined8 *in_RDI;
  
  if ((*(byte *)(in_RDI + 1) & 1) != 0) {
    if ((void *)*in_RDI != (void *)0x0) {
      operator_delete__((void *)*in_RDI);
    }
    if ((void *)in_RDI[8] != (void *)0x0) {
      operator_delete__((void *)in_RDI[8]);
    }
    if ((void *)in_RDI[6] != (void *)0x0) {
      operator_delete__((void *)in_RDI[6]);
    }
    if ((void *)in_RDI[5] != (void *)0x0) {
      operator_delete__((void *)in_RDI[5]);
    }
    if ((void *)in_RDI[7] != (void *)0x0) {
      operator_delete__((void *)in_RDI[7]);
    }
    if ((void *)in_RDI[3] != (void *)0x0) {
      operator_delete__((void *)in_RDI[3]);
    }
  }
  return;
}

Assistant:

~SparseMatrix(){

        if(own_data) {

            delete[] score_rows;
            delete[] csr_row_ptr;
            delete[] csr_col_idx;
            delete[] ccs_row_idx;
            delete[] ccs_col_ptr;
            delete[] ccs_rating_scores;

        }
    }